

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_uint * nk_add_value(nk_context *ctx,nk_window *win,nk_hash name,nk_uint value)

{
  nk_table *pnVar1;
  nk_page_element *ptr;
  nk_uint *pnVar2;
  ushort uVar3;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4285,
                  "nk_uint *nk_add_value(struct nk_context *, struct nk_window *, nk_hash, nk_uint)"
                 );
  }
  if (win != (nk_window *)0x0) {
    ptr = (nk_page_element *)win->tables;
    if ((ptr == (nk_page_element *)0x0) || (uVar3 = win->table_size, 0x34 < uVar3)) {
      ptr = nk_create_page_element(ctx);
      nk_zero(ptr,0x1d0);
      pnVar1 = win->tables;
      if (pnVar1 == (nk_table *)0x0) {
        win->tables = (nk_table *)ptr;
        (ptr->data).tbl.next = (nk_table *)0x0;
        (ptr->data).tbl.prev = (nk_table *)0x0;
        win->table_count = 1;
        ptr = (nk_page_element *)win->tables;
      }
      else {
        pnVar1->prev = (nk_table *)ptr;
        (ptr->data).tbl.next = pnVar1;
        (ptr->data).tbl.prev = (nk_table *)0x0;
        win->tables = (nk_table *)ptr;
        win->table_count = win->table_count + 1;
      }
      uVar3 = 0;
    }
    (ptr->data).tbl.seq = win->seq;
    pnVar2 = (nk_uint *)((long)&ptr->data + (ulong)uVar3 * 4 + 0xd8);
    *(nk_hash *)((long)&ptr->data + (ulong)uVar3 * 4 + 4) = name;
    *pnVar2 = 0;
    win->table_size = uVar3 + 1;
    return pnVar2;
  }
  __assert_fail("win",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x4286,
                "nk_uint *nk_add_value(struct nk_context *, struct nk_window *, nk_hash, nk_uint)");
}

Assistant:

NK_INTERN nk_uint*
nk_add_value(struct nk_context *ctx, struct nk_window *win,
            nk_hash name, nk_uint value)
{
    NK_ASSERT(ctx);
    NK_ASSERT(win);
    if (!win || !ctx) return 0;
    if (!win->tables || win->table_size >= NK_VALUE_PAGE_CAPACITY) {
        struct nk_table *tbl = nk_create_table(ctx);
        NK_ASSERT(tbl);
        if (!tbl) return 0;
        nk_push_table(win, tbl);
    }
    win->tables->seq = win->seq;
    win->tables->keys[win->table_size] = name;
    win->tables->values[win->table_size] = value;
    return &win->tables->values[win->table_size++];
}